

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_spm_session::try_add_bigram(llm_tokenizer_spm_session *this,int left,int right)

{
  char *pcVar1;
  size_t sVar2;
  vector<llm_bigram_spm,_std::allocator<llm_bigram_spm>_> *pvVar3;
  uint uVar4;
  uint32_t uVar5;
  reference pvVar6;
  mapped_type *this_00;
  int in_EDX;
  int in_ESI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  *in_RDI;
  llm_bigram_spm bigram;
  token_data *tok_data;
  llama_token token;
  string text;
  int *in_stack_ffffffffffffff38;
  llama_vocab *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  value_type *__x;
  priority_queue<llm_bigram_spm,_std::vector<llm_bigram_spm,_std::allocator<llm_bigram_spm>_>,_llm_bigram_spm::comparator>
  *this_01;
  key_type *__k;
  pair<int,_int> local_78;
  int local_70;
  int local_6c;
  float local_68;
  undefined8 local_60;
  token_data *local_58;
  undefined4 local_4c;
  uint local_48;
  undefined1 local_31 [33];
  int local_10;
  int local_c;
  
  if ((in_ESI != -1) && (in_EDX != -1)) {
    __x = (value_type *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
    local_10 = in_EDX;
    local_c = in_ESI;
    pvVar6 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                       ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)__x,(long)in_ESI);
    pcVar1 = pvVar6->text;
    pvVar6 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                       ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)__x,(long)local_c);
    this_01 = (priority_queue<llm_bigram_spm,_std::vector<llm_bigram_spm,_std::allocator<llm_bigram_spm>_>,_llm_bigram_spm::comparator>
               *)pvVar6->n;
    pvVar6 = llama_vocab::std::vector<llm_symbol,_std::allocator<llm_symbol>_>::operator[]
                       ((vector<llm_symbol,_std::allocator<llm_symbol>_> *)__x,(long)local_10);
    sVar2 = pvVar6->n;
    pvVar3 = &this_01->c;
    __k = (key_type *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_31 + 1),pcVar1,
               (long)&(pvVar3->super__Vector_base<llm_bigram_spm,_std::allocator<llm_bigram_spm>_>).
                      _M_impl.super__Vector_impl_data._M_start + sVar2,(allocator *)__k);
    std::allocator<char>::~allocator((allocator<char> *)local_31);
    uVar4 = llama_vocab::text_to_token
                      ((llama_vocab *)__x,
                       (string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_48 = uVar4;
    if (uVar4 == 0xffffffff) {
      local_4c = 1;
    }
    else {
      uVar5 = llama_vocab::n_tokens((llama_vocab *)0x542ad6);
      if (uVar4 < uVar5) {
        local_58 = llama_vocab::get_token_data
                             (in_stack_ffffffffffffff40,
                              (llama_token)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        local_70 = local_c;
        local_6c = local_10;
        local_68 = local_58->score;
        local_60 = std::__cxx11::string::size();
        llama_vocab::std::
        priority_queue<llm_bigram_spm,_std::vector<llm_bigram_spm,_std::allocator<llm_bigram_spm>_>,_llm_bigram_spm::comparator>
        ::push(this_01,__x);
        local_78 = std::make_pair<int&,int&>(in_stack_ffffffffffffff38,(int *)0x542b74);
        this_00 = llama_vocab::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                  ::operator[](in_RDI,__k);
        llama_vocab::std::pair<int,_int>::operator=(this_00,(type)&local_78);
        local_4c = 0;
      }
      else {
        local_4c = 1;
      }
    }
    std::__cxx11::string::~string((string *)(local_31 + 1));
  }
  return;
}

Assistant:

void try_add_bigram(int left, int right) {
        if (left == -1 || right == -1) {
            return;
        }
        const std::string text = std::string(symbols[left].text, symbols[left].n + symbols[right].n);
        auto token = vocab.text_to_token(text);

        if (token == LLAMA_TOKEN_NULL) {
            return;
        }

        if (static_cast<uint32_t>(token) >= vocab.n_tokens()) {
            return;
        }

        const auto & tok_data = vocab.get_token_data(token);

        llm_bigram_spm bigram;
        bigram.left  = left;
        bigram.right = right;
        bigram.score = tok_data.score;
        bigram.size  = text.size();

        work_queue.push(bigram);

        // Do we need to support is_unused?
        rev_merge[text] = std::make_pair(left, right);
    }